

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

int genxCharClass(genxWriter w,int c)

{
  int iVar1;
  int in_ESI;
  genxWriter in_RDI;
  int ret;
  uint local_10;
  
  iVar1 = isXMLChar(in_RDI,in_ESI);
  local_10 = (uint)(iVar1 != 0);
  iVar1 = isNameChar(in_RDI,in_ESI);
  if (iVar1 != 0) {
    local_10 = local_10 | 4;
  }
  iVar1 = isLetter(in_RDI,in_ESI);
  if (iVar1 != 0) {
    local_10 = local_10 | 2;
  }
  return local_10;
}

Assistant:

int genxCharClass(genxWriter w, int c)
{
  int ret = 0;

  if (isXMLChar(w, c))
    ret |= GENX_XML_CHAR;
  if (isNameChar(w, c))
    ret |= GENX_NAMECHAR;
  if (isLetter(w, c))
    ret |= GENX_LETTER;
  return ret;
}